

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invocation_interlock_placement_pass.cpp
# Opt level: O0

BasicBlock * __thiscall
spvtools::opt::InvocationInterlockPlacementPass::splitEdge
          (InvocationInterlockPlacementPass *this,BasicBlock *block,uint32_t succ_id)

{
  initializer_list<unsigned_int> init_list;
  pointer pBVar1;
  Op OVar2;
  Function *this_00;
  Instruction *pIVar3;
  bool bVar4;
  Operand *local_150;
  anon_class_16_2_bcb6efe2 local_148;
  function<bool_(unsigned_int_*)> local_138;
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  Instruction *local_f8;
  Instruction *local_f0;
  SmallVector<unsigned_int,_2UL> local_e8;
  undefined1 local_c0 [48];
  undefined1 local_90 [40];
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_68;
  pointer local_60;
  BasicBlock *new_succ;
  uint32_t local_44 [2];
  Op local_3c;
  IRContext *local_38;
  unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_> local_30;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_> local_28;
  unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
  new_succ_temp;
  uint32_t succ_id_local;
  BasicBlock *block_local;
  InvocationInterlockPlacementPass *this_local;
  
  new_succ_temp._M_t.
  super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>.
  _M_t.
  super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
  .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl._4_4_ = succ_id;
  local_38 = Pass::context(&this->super_Pass);
  local_3c = OpLabel;
  local_44[1] = 0;
  local_44[0] = Pass::TakeNextId(&this->super_Pass);
  std::initializer_list<spvtools::opt::Operand>::initializer_list
            ((initializer_list<spvtools::opt::Operand> *)&new_succ);
  MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,unsigned_int,std::initializer_list<spvtools::opt::Operand>>
            ((spvtools *)&local_30,&local_38,&local_3c,(int *)(local_44 + 1),local_44,
             (initializer_list<spvtools::opt::Operand> *)&new_succ);
  MakeUnique<spvtools::opt::BasicBlock,std::unique_ptr<spvtools::opt::Instruction,std::default_delete<spvtools::opt::Instruction>>>
            ((spvtools *)&local_28,&local_30);
  std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
  ~unique_ptr(&local_30);
  local_60 = std::
             unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
             ::get(&local_28);
  this_00 = BasicBlock::GetParent(block);
  Function::InsertBasicBlockAfter(this_00,&local_28,block);
  pBVar1 = local_60;
  local_90._32_8_ = Pass::context(&this->super_Pass);
  local_90[0x1c] = -7;
  local_90[0x1d] = '\0';
  local_90[0x1e] = '\0';
  local_90[0x1f] = '\0';
  local_90[0x18] = '\0';
  local_90[0x19] = '\0';
  local_90[0x1a] = '\0';
  local_90[0x1b] = '\0';
  local_90._20_4_ = 0;
  local_108._12_4_ =
       new_succ_temp._M_t.
       super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
       ._M_t.
       super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
       .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl._4_4_;
  local_f8 = (Instruction *)(local_108 + 0xc);
  local_f0 = (Instruction *)0x1;
  init_list._M_len = 1;
  init_list._M_array = (iterator)local_f8;
  utils::SmallVector<unsigned_int,_2UL>::SmallVector(&local_e8,init_list);
  Operand::Operand((Operand *)local_c0,SPV_OPERAND_TYPE_ID,&local_e8);
  local_90._0_8_ = local_c0;
  local_90._8_4_ = 1;
  local_90._12_4_ = 0;
  MakeUnique<spvtools::opt::Instruction,spvtools::opt::IRContext*,spv::Op,int,int,std::initializer_list<spvtools::opt::Operand>>
            ((spvtools *)&local_68,(IRContext **)(local_90 + 0x20),(Op *)(local_90 + 0x1c),
             (int *)(local_90 + 0x18),(int *)(local_90 + 0x14),
             (initializer_list<spvtools::opt::Operand> *)local_90);
  BasicBlock::AddInstruction(pBVar1,&local_68);
  std::unique_ptr<spvtools::opt::Instruction,_std::default_delete<spvtools::opt::Instruction>_>::
  ~unique_ptr(&local_68);
  local_150 = (Operand *)local_90;
  do {
    local_150 = local_150 + -1;
    Operand::~Operand(local_150);
  } while (local_150 != (Operand *)local_c0);
  utils::SmallVector<unsigned_int,_2UL>::~SmallVector(&local_e8);
  BasicBlock::tail((BasicBlock *)local_108);
  pIVar3 = utils::IntrusiveList<spvtools::opt::Instruction>::
           iterator_template<spvtools::opt::Instruction>::operator->
                     ((iterator_template<spvtools::opt::Instruction> *)local_108);
  OVar2 = Instruction::opcode(pIVar3);
  bVar4 = true;
  if (OVar2 != OpBranchConditional) {
    BasicBlock::tail((BasicBlock *)(local_118 + 8));
    pIVar3 = utils::IntrusiveList<spvtools::opt::Instruction>::
             iterator_template<spvtools::opt::Instruction>::operator->
                       ((iterator_template<spvtools::opt::Instruction> *)(local_118 + 8));
    OVar2 = Instruction::opcode(pIVar3);
    bVar4 = OVar2 == OpSwitch;
  }
  if (!bVar4) {
    __assert_fail("block->tail()->opcode() == spv::Op::OpBranchConditional || block->tail()->opcode() == spv::Op::OpSwitch"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/opt/invocation_interlock_placement_pass.cpp"
                  ,0x137,
                  "BasicBlock *spvtools::opt::InvocationInterlockPlacementPass::splitEdge(BasicBlock *, uint32_t)"
                 );
  }
  BasicBlock::tail((BasicBlock *)local_118);
  pIVar3 = utils::IntrusiveList<spvtools::opt::Instruction>::
           iterator_template<spvtools::opt::Instruction>::operator->
                     ((iterator_template<spvtools::opt::Instruction> *)local_118);
  local_148.new_succ = local_60;
  local_148.succ_id =
       new_succ_temp._M_t.
       super___uniq_ptr_impl<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>
       ._M_t.
       super__Tuple_impl<0UL,_spvtools::opt::BasicBlock_*,_std::default_delete<spvtools::opt::BasicBlock>_>
       .super__Head_base<0UL,_spvtools::opt::BasicBlock_*,_false>._M_head_impl._4_4_;
  std::function<bool(unsigned_int*)>::
  function<spvtools::opt::InvocationInterlockPlacementPass::splitEdge(spvtools::opt::BasicBlock*,unsigned_int)::__0,void>
            ((function<bool(unsigned_int*)> *)&local_138,&local_148);
  Instruction::WhileEachInId(pIVar3,&local_138);
  std::function<bool_(unsigned_int_*)>::~function(&local_138);
  pBVar1 = local_60;
  std::unique_ptr<spvtools::opt::BasicBlock,_std::default_delete<spvtools::opt::BasicBlock>_>::
  ~unique_ptr(&local_28);
  return pBVar1;
}

Assistant:

BasicBlock* InvocationInterlockPlacementPass::splitEdge(BasicBlock* block,
                                                        uint32_t succ_id) {
  // Create a new block to replace the critical edge.
  auto new_succ_temp = MakeUnique<BasicBlock>(
      MakeUnique<Instruction>(context(), spv::Op::OpLabel, 0, TakeNextId(),
                              std::initializer_list<Operand>{}));
  auto* new_succ = new_succ_temp.get();

  // Insert the new block into the function.
  block->GetParent()->InsertBasicBlockAfter(std::move(new_succ_temp), block);

  new_succ->AddInstruction(MakeUnique<Instruction>(
      context(), spv::Op::OpBranch, 0, 0,
      std::initializer_list<Operand>{
          Operand(spv_operand_type_t::SPV_OPERAND_TYPE_ID, {succ_id})}));

  assert(block->tail()->opcode() == spv::Op::OpBranchConditional ||
         block->tail()->opcode() == spv::Op::OpSwitch);

  // Update the first branch to successor to instead branch to
  // the new successor. If there are multiple edges, we arbitrarily choose the
  // first time it appears in the list. The other edges to `succ_id` will have
  // to be split by another call to `splitEdge`.
  block->tail()->WhileEachInId([new_succ, succ_id](uint32_t* branch_id) {
    if (*branch_id == succ_id) {
      *branch_id = new_succ->id();
      return false;
    }
    return true;
  });

  return new_succ;
}